

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O1

int __thiscall cxxpool::thread_pool::shutdown(thread_pool *this,int __fd,int __how)

{
  pointer ptVar1;
  int iVar2;
  thread *thread;
  pointer ptVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->task_mutex_);
  if (iVar2 == 0) {
    this->done_ = true;
    this->paused_ = false;
    pthread_mutex_unlock((pthread_mutex_t *)&this->task_mutex_);
    std::condition_variable::notify_all();
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->thread_mutex_);
    if (iVar2 == 0) {
      ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1)
      {
        std::thread::join();
      }
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->thread_mutex_);
      return iVar2;
    }
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void shutdown() {
        {
            std::lock_guard<std::mutex> task_lock(task_mutex_);
            done_ = true;
            paused_ = false;
        }
        task_cond_var_.notify_all();
        std::lock_guard<std::mutex> thread_lock(thread_mutex_);
        for (auto& thread : threads_)
            thread.join();
    }